

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  byte bVar1;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  pointer __n;
  undefined1 auVar2 [16];
  pointer paVar3;
  int iVar4;
  FP32 FVar5;
  FILE *__stream;
  size_type sVar6;
  size_t sVar7;
  char *pcVar8;
  float ***pppfVar9;
  float **ppfVar10;
  int *piVar11;
  reference dst;
  reference pvVar12;
  ulong uVar13;
  float *pfVar14;
  ushort *puVar15;
  uint *puVar16;
  size_t sVar17;
  char **ppcVar18;
  int i;
  ulong uVar19;
  long lVar20;
  int c;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int *piVar25;
  FP16 h;
  int iVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  char *local_168;
  size_type local_158;
  uint local_150;
  allocator_type local_141;
  pointer local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ulong local_118;
  ulong local_108;
  int local_100;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<float,_std::allocator<float>_> image;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<char,_std::allocator<char>_> buf;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar8 = "Invalid argument.";
LAB_001abdf1:
    *err = pcVar8;
    return -1;
  }
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar8 = "Cannot read file.";
    goto LAB_001abdf1;
  }
  fseek(__stream,0,2);
  sVar6 = ftell(__stream);
  fseek(__stream,0,0);
  if (sVar6 == 0) {
    fclose(__stream);
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar8 = "File size is zero.";
    goto LAB_001abdf1;
  }
  std::vector<char,_std::allocator<char>_>::vector(&buf,sVar6,(allocator_type *)&image);
  sVar7 = fread(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start,1,sVar6,__stream);
  if (sVar7 != sVar6) {
    __assert_fail("ret == filesize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x27eb,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
  }
  fclose(__stream);
  if (*(int *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start == 0x1312f76) {
    if ((((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[4] == '\x02') &&
         (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[5] == '\b')) &&
        (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[6] == '\0')) &&
       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [7] == '\0')) {
      local_168 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar26 = -3;
      local_118 = 0xffffffff;
      local_100 = -1;
      local_140 = (pointer)CONCAT44(local_140._4_4_,0xffffffff);
      iVar21 = -1;
      local_150 = 0xffffffff;
      local_158._0_4_ = 1;
      local_108 = local_118;
      do {
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_1_ = 0;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar8 = anon_unknown.dwarf_17633d::ReadAttribute
                           ((string *)&image,(string *)&offsets,&data,local_168);
        if (pcVar8 == (char *)0x0) {
          local_168 = local_168 + 1;
          iVar4 = 2;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&image);
          if (iVar4 == 0) {
            bVar1 = *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar1 < 4) {
              if (bVar1 == 3) {
                local_158._0_4_ = 0x10;
              }
              local_150 = (uint)bVar1;
LAB_001ac073:
              iVar4 = 0;
              local_168 = pcVar8;
            }
            else {
              if (err != (char **)0x0) {
                *err = "Unsupported compression type.";
              }
              iVar26 = -5;
LAB_001ac08d:
              iVar4 = 1;
            }
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&image);
            if (iVar4 == 0) {
              anon_unknown.dwarf_17633d::ReadChannelInfo(&channels,&data);
              local_118 = ((long)channels.
                                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)channels.
                                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              if ((int)local_118 < 1) {
                if (err != (char **)0x0) {
                  *err = "Invalid channels format.";
                }
                iVar26 = -6;
                goto LAB_001ac08d;
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&image);
              if (iVar4 == 0) {
                pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
                local_140 = (pointer)CONCAT44(local_140._4_4_,*(undefined4 *)pvVar12);
                piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,4);
                local_100 = *piVar11;
                puVar16 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (&data,8);
                local_108 = (ulong)*puVar16;
                piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0xc);
                iVar21 = *piVar11;
                goto LAB_001ac073;
              }
              iVar4 = std::__cxx11::string::compare((char *)&image);
              if (iVar4 == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
                iVar4 = 0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,4);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,8);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0xc);
                local_168 = pcVar8;
                goto LAB_001ac08f;
              }
            }
            iVar4 = 0;
            local_168 = pcVar8;
          }
        }
LAB_001ac08f:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&image);
      } while (iVar4 == 0);
      if (iVar4 == 2) {
        if ((int)local_140 < 0) {
          __assert_fail("dx >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2865,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        if (local_100 < 0) {
          __assert_fail("dy >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2866,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        if ((int)local_108 < 0) {
          __assert_fail("dw >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2867,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        if (iVar21 < 0) {
          __assert_fail("dh >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2868,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        if ((int)local_118 < 1) {
          __assert_fail("numChannels >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2869,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        iVar27 = (int)local_108 - (int)local_140;
        iVar26 = iVar27 + 1;
        iVar21 = iVar21 - local_100;
        iVar4 = iVar21 + 1;
        std::vector<float,_std::allocator<float>_>::vector
                  (&image,(long)(iVar4 * iVar26 * 4),(allocator_type *)&offsets);
        uVar28 = (uint)((int)local_158 * (iVar4 / (int)local_158) <= iVar21) +
                 iVar4 / (int)local_158;
        std::vector<long_long,_std::allocator<long_long>_>::vector
                  (&offsets,(long)(int)uVar28,(allocator_type *)&data);
        uVar19 = 0;
        uVar24 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          uVar24 = uVar19;
        }
        for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
          offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] = *(longlong *)(local_168 + uVar19 * 8);
        }
        if ((local_150 < 4) && (local_150 != 1)) {
          uVar19 = local_118 & 0xffffffff;
          pppfVar9 = (float ***)malloc(uVar19 * 8);
          deepImage->image = pppfVar9;
          for (uVar22 = 0; ppfVar10 = (float **)malloc((long)iVar4 << 3), uVar19 != uVar22;
              uVar22 = uVar22 + 1) {
            deepImage->image[uVar22] = ppfVar10;
          }
          deepImage->offset_table = (int **)ppfVar10;
          for (lVar29 = 0; lVar29 <= iVar21; lVar29 = lVar29 + 1) {
            piVar11 = (int *)malloc((long)iVar26 * 4);
            deepImage->offset_table[lVar29] = piVar11;
          }
          local_140 = channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          piVar11 = &(channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pixelType;
          for (uVar22 = 0; uVar22 != uVar24; uVar22 = uVar22 + 1) {
            lVar29 = offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            srcSize = *(unsigned_long *)
                       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar29 + 4);
            srcSize_00 = *(unsigned_long *)
                          (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar29 + 0xc);
            __n = *(pointer *)
                   (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar29 + 0x14);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&data,(long)iVar26,
                       (allocator_type *)&sampleData);
            sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 -(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            dst = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)&data,0);
            anon_unknown.dwarf_17633d::DecompressZip
                      ((uchar *)dst,(unsigned_long *)&sampleData,
                       (uchar *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29 + 0x1c),srcSize);
            if (sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start !=
                data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
                -(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
              __assert_fail("dstLen == pixelOffsetTable.size() * sizeof(int)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28b7,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            for (lVar20 = 0; lVar20 <= iVar27; lVar20 = lVar20 + 1) {
              deepImage->offset_table[uVar22][lVar20] =
                   *(int *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar20 * 4);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&sampleData,(size_type)__n,(allocator_type *)&channelOffsetList);
            channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = __n;
            pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&sampleData,0);
            anon_unknown.dwarf_17633d::DecompressZip
                      (pvVar12,(unsigned_long *)&channelOffsetList,
                       (uchar *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29 + 0x1c + srcSize),
                       srcSize_00);
            if (channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != __n) {
              __assert_fail("dstLen == (unsigned long)unpackedSampleDataSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28c5,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            std::vector<int,_std::allocator<int>_>::vector(&channelOffsetList,uVar19,&local_141);
            uVar28 = 0;
            piVar25 = piVar11;
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] = uVar28;
              if (2 < (ulong)(uint)*piVar25) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x28d6,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              uVar28 = uVar28 + *(int *)(&DAT_001f2338 + (ulong)(uint)*piVar25 * 4);
              piVar25 = piVar25 + 0xc;
            }
            if (uVar28 == 0) {
              __assert_fail("sampleSize >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28db,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            if ((long)sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                (long)(int)uVar28 *
                (long)*(int *)(data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + (long)iVar27 * 4)) {
              __assert_fail("(size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size()"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28dd,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            auVar2._8_8_ = 0;
            auVar2._0_8_ = (long)(int)uVar28 *
                           (long)*(int *)(data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                         (long)iVar27 * 4);
            lVar20 = (long)SUB164(auVar2 / ZEXT416(uVar28),0);
            lVar29 = SUB168(auVar2 / ZEXT416(uVar28),0) << 0x20;
            sVar7 = lVar29 >> 0x1e;
            local_158 = 0;
            for (uVar13 = 0; uVar13 != uVar19; uVar13 = uVar13 + 1) {
              pfVar14 = (float *)malloc(sVar7);
              deepImage->image[uVar13][uVar22] = pfVar14;
              sVar17 = sVar7;
              if (local_140[uVar13].pixelType == 0) {
                sVar6 = local_158;
                for (lVar23 = 0; lVar23 < lVar20; lVar23 = lVar23 + 1) {
                  puVar16 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              (&sampleData,sVar6);
                  deepImage->image[uVar13][uVar22][lVar23] = (float)*puVar16;
                  sVar6 = sVar6 + 4;
                }
              }
              else if (local_140[uVar13].pixelType == 1) {
                sVar6 = local_158;
                for (lVar23 = 0; sVar17 = lVar29 >> 0x1f, lVar23 < lVar20; lVar23 = lVar23 + 1) {
                  puVar15 = (ushort *)
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (&sampleData,sVar6);
                  h._2_2_ = 0;
                  h.u = *puVar15;
                  FVar5 = anon_unknown.dwarf_17633d::half_to_float(h);
                  *(FP32 *)(deepImage->image[uVar13][uVar22] + lVar23) = FVar5;
                  sVar6 = sVar6 + 2;
                }
              }
              else {
                sVar6 = local_158;
                for (lVar23 = 0; lVar23 < lVar20; lVar23 = lVar23 + 1) {
                  pfVar14 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&sampleData,sVar6);
                  deepImage->image[uVar13][uVar22][lVar23] = *pfVar14;
                  sVar6 = sVar6 + 4;
                }
              }
              local_158 = local_158 + sVar17;
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&channelOffsetList.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sampleData);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&data);
          }
          deepImage->width = iVar26;
          deepImage->height = iVar4;
          ppcVar18 = (char **)malloc(uVar19 * 8);
          deepImage->channel_names = ppcVar18;
          for (uVar24 = 0; paVar3 = local_140, uVar19 != uVar24; uVar24 = uVar24 + 1) {
            pcVar8 = strdup((local_140->name)._M_dataplus._M_p);
            deepImage->channel_names[uVar24] = pcVar8;
            local_140 = paVar3 + 1;
          }
          deepImage->num_channels = (int)local_118;
          iVar26 = 0;
        }
        else {
          iVar26 = -10;
          if (err != (char **)0x0) {
            *err = "Unsupported format.";
          }
        }
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  (&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&image.super__Vector_base<float,_std::allocator<float>_>);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::~vector(&channels);
      goto LAB_001abe21;
    }
    iVar26 = -4;
    if (err == (char **)0x0) goto LAB_001abe21;
    pcVar8 = "Unsupported version or scanline.";
  }
  else {
    iVar26 = -3;
    if (err == (char **)0x0) goto LAB_001abe21;
    pcVar8 = "Header mismatch.";
  }
  *err = pcVar8;
LAB_001abe21:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return iVar26;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}